

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Tracer_testTracerSimpleChild_Test::TestBody(Tracer_testTracerSimpleChild_Test *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  char *pcVar4;
  pointer pSVar5;
  undefined4 extraout_var;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>
  option_list_00;
  AssertionResult local_148 [2];
  AssertHelper local_128 [8];
  Message local_120 [8];
  undefined1 local_118 [8];
  AssertionResult gtest_ar__1;
  option_wrapper<opentracing::v3::StartSpanOption> local_f0;
  option_wrapper<opentracing::v3::StartSpanOption> *local_e8;
  undefined8 local_e0;
  string_view local_d8;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> local_c8;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> spanChild;
  AssertionResult local_b8 [2];
  AssertHelper local_98 [8];
  Message local_90 [24];
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  string_view local_58;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> local_48;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> spanRoot;
  undefined1 local_30 [8];
  shared_ptr<jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  Tracer_testTracerSimpleChild_Test *this_local;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)local_30);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr
            ((shared_ptr<opentracing::v3::Tracer> *)&spanRoot);
  peVar3 = std::__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  opentracing::v3::string_view::string_view(&local_58,"test-simple-root");
  std::initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>::
  initializer_list((initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>
                    *)&gtest_ar_.message_);
  operation_name.length_ = (size_t)local_58.data_;
  operation_name.data_ = (char *)peVar3;
  option_list._M_len = (size_type)gtest_ar_.message_.ptr_;
  option_list._M_array = (iterator)local_58.length_;
  opentracing::v3::Tracer::StartSpan((Tracer *)&local_48,operation_name,option_list);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<opentracing::v3::Span,std::default_delete<opentracing::v3::Span>>>
            ((AssertionResult *)local_78,&local_48,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_b8,local_78,"spanRoot","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x1f8,pcVar4);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)local_b8);
    testing::Message::~Message(local_90);
  }
  spanChild._M_t.
  super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t.
  super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
  super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._5_3_ = 0;
  spanChild._M_t.
  super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t.
  super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
  super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (spanChild._M_t.
      super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t
      .super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
      super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._4_4_ == 0) {
    peVar3 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    opentracing::v3::string_view::string_view(&local_d8,"test-simple-child");
    pSVar5 = std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::
             operator->(&local_48);
    iVar2 = (*pSVar5->_vptr_Span[10])();
    opentracing::v3::ChildOf
              ((SpanReference *)&gtest_ar__1.message_,(SpanContext *)CONCAT44(extraout_var,iVar2));
    opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>::option_wrapper
              (&local_f0,(StartSpanOption *)&gtest_ar__1.message_);
    local_e8 = &local_f0;
    local_e0 = 1;
    operation_name_00.length_ = (size_t)local_d8.data_;
    operation_name_00.data_ = (char *)peVar3;
    option_list_00._M_len = (size_type)local_e8;
    option_list_00._M_array = (iterator)local_d8.length_;
    opentracing::v3::Tracer::StartSpan((Tracer *)&local_c8,operation_name_00,option_list_00);
    opentracing::v3::SpanReference::~SpanReference((SpanReference *)&gtest_ar__1.message_);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<opentracing::v3::Span,std::default_delete<opentracing::v3::Span>>>
              ((AssertionResult *)local_118,&local_c8,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_148,local_118,"spanChild","false");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x1fb,pcVar4);
      testing::internal::AssertHelper::operator=(local_128,local_120);
      testing::internal::AssertHelper::~AssertHelper(local_128);
      std::__cxx11::string::~string((string *)local_148);
      testing::Message::~Message(local_120);
    }
    spanChild._M_t.
    super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t.
    super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
    super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._5_3_ = 0;
    spanChild._M_t.
    super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t.
    super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
    super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (spanChild._M_t.
        super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>.
        _M_t.
        super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>
        .super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._4_4_ == 0) {
      spanChild._M_t.
      super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t
      .super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
      super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._4_4_ = 0;
    }
    std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::~unique_ptr
              (&local_c8);
  }
  std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::~unique_ptr
            (&local_48);
  if (spanChild._M_t.
      super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t
      .super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
      super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._4_4_ == 0) {
    peVar3 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    (**(code **)(*(long *)peVar3 + 0x58))();
    spanChild._M_t.
    super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>._M_t.
    super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>.
    super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl._4_4_ = 0;
  }
  std::shared_ptr<jaegertracing::Tracer>::~shared_ptr((shared_ptr<jaegertracing::Tracer> *)local_30)
  ;
  std::shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>::~shared_ptr
            ((shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> *)
             &tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Tracer, testTracerSimpleChild)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        auto spanRoot = tracer->StartSpan("test-simple-root");
        ASSERT_TRUE(spanRoot);
        auto spanChild = tracer->StartSpan("test-simple-child",
            { opentracing::ChildOf(&spanRoot->context()) });
        ASSERT_TRUE(spanChild);
    }
    tracer->Close();
}